

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::operator()(iterator *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
            *this,basic_string_view<wchar_t> value)

{
  char cVar1;
  uint uVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  value_type_conflict vVar5;
  undefined4 uVar6;
  void *__buf;
  wchar_t *data;
  str_writer<wchar_t> local_30;
  
  __buf = (void *)value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write(&this->writer_,(int)value.data_,__buf,(size_t)__buf);
  }
  else {
    cVar1 = (this->specs_->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_30,"invalid type specifier");
    }
    uVar2 = (this->specs_->super_core_format_specs).precision;
    local_30.size_ = (size_t)(ulong)uVar2;
    if (__buf <= (void *)(ulong)uVar2) {
      local_30.size_ = (size_t)__buf;
    }
    if ((int)uVar2 < 0) {
      local_30.size_ = (size_t)__buf;
    }
    local_30.s = value.data_;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                *)this,&this->specs_->super_align_spec,&local_30);
  }
  pwVar3 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.out_;
  sVar4 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.limit_;
  vVar5 = (this->writer_).out_.blackhole_;
  uVar6 = *(undefined4 *)&(this->writer_).out_.field_0x1c;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ =
       (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.count_;
  __return_storage_ptr__->blackhole_ = vVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar6;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar3;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sVar4;
  return __return_storage_ptr__;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }